

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svector_test.cc
# Opt level: O2

void __thiscall
fizplex::SVectorTest_ReorderedVectorsAreEqual_Test::TestBody
          (SVectorTest_ReorderedVectorsAreEqual_Test *this)

{
  bool bVar1;
  char *in_R9;
  initializer_list<fizplex::SVector::Nonzero> l;
  initializer_list<fizplex::SVector::Nonzero> l_00;
  AssertHelper AStack_a8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  AssertionResult gtest_ar_;
  SVector w;
  SVector v;
  string local_58;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_28 = 7;
  uStack_20 = 0xc000e147ae147ae1;
  local_38 = 2;
  uStack_30 = 0x4022000000000000;
  local_58.field_2._M_allocated_capacity = 1;
  local_58.field_2._8_8_ = 0x4008000000000000;
  local_58._M_dataplus._M_p = (pointer)0x0;
  local_58._M_string_length = 0xc000000000000000;
  l._M_len = 4;
  l._M_array = (iterator)&local_58;
  SVector::SVector(&v,l);
  local_28 = 1;
  uStack_20 = 0x4008000000000000;
  local_38 = 7;
  uStack_30 = 0xc000e147ae147ae1;
  local_58.field_2._M_allocated_capacity = 0;
  local_58.field_2._8_8_ = 0xc000000000000000;
  local_58._M_dataplus._M_p = (char *)0x2;
  local_58._M_string_length = 0x4022000000000000;
  l_00._M_len = 4;
  l_00._M_array = (iterator)&local_58;
  SVector::SVector(&w,l_00);
  gtest_ar_.success_ = SVector::operator==(&v,&w);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_58,(internal *)&gtest_ar_,(AssertionResult *)"v == w","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/svector_test.cc"
               ,0x1e,local_58._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_a8,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_a8);
    std::__cxx11::string::~string((string *)&local_58);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = SVector::operator==(&w,&v);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_58,(internal *)&gtest_ar_,(AssertionResult *)"w == v","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/svector_test.cc"
               ,0x1f,local_58._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_a8,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_a8);
    std::__cxx11::string::~string((string *)&local_58);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  bVar1 = SVector::operator!=(&v,&w);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar1) {
    testing::Message::Message((Message *)&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_58,(internal *)&gtest_ar_,(AssertionResult *)"!(v != w)","false","true",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&AStack_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/svector_test.cc"
               ,0x20,local_58._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_a8,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_a8);
    std::__cxx11::string::~string((string *)&local_58);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  bVar1 = SVector::operator!=(&w,&v);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar1) {
    testing::Message::Message((Message *)&local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_58,(internal *)&gtest_ar_,(AssertionResult *)"!(w != v)","false","true",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&AStack_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/svector_test.cc"
               ,0x21,local_58._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_a8,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_a8);
    std::__cxx11::string::~string((string *)&local_58);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::_Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>::
  ~_Vector_base((_Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                 *)&w);
  std::_Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>::
  ~_Vector_base((_Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                 *)&v);
  return;
}

Assistant:

TEST(SVectorTest, ReorderedVectorsAreEqual) {
  const SVector v = {{0, -2}, {1, 3}, {2, 9}, {7, -2.11}};
  const SVector w = {{2, 9}, {0, -2}, {7, -2.11}, {1, 3}};
  EXPECT_TRUE(v == w);
  EXPECT_TRUE(w == v);
  EXPECT_TRUE(!(v != w));
  EXPECT_TRUE(!(w != v));
}